

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_is_revoked(mbedtls_x509_crt *crt,mbedtls_x509_crl *crl)

{
  int iVar1;
  bool bVar2;
  mbedtls_x509_crl_entry *local_28;
  mbedtls_x509_crl_entry *cur;
  mbedtls_x509_crl *crl_local;
  mbedtls_x509_crt *crt_local;
  
  local_28 = &crl->entry;
  while( true ) {
    bVar2 = false;
    if (local_28 != (mbedtls_x509_crl_entry *)0x0) {
      bVar2 = (local_28->serial).len != 0;
    }
    if (!bVar2) break;
    if ((((crt->serial).len == (local_28->serial).len) &&
        (iVar1 = memcmp((crt->serial).p,(local_28->serial).p,(crt->serial).len), iVar1 == 0)) &&
       (iVar1 = mbedtls_x509_time_is_past(&local_28->revocation_date), iVar1 != 0)) {
      return 1;
    }
    local_28 = local_28->next;
  }
  return 0;
}

Assistant:

int mbedtls_x509_crt_is_revoked( const mbedtls_x509_crt *crt, const mbedtls_x509_crl *crl )
{
    const mbedtls_x509_crl_entry *cur = &crl->entry;

    while( cur != NULL && cur->serial.len != 0 )
    {
        if( crt->serial.len == cur->serial.len &&
            memcmp( crt->serial.p, cur->serial.p, crt->serial.len ) == 0 )
        {
            if( mbedtls_x509_time_is_past( &cur->revocation_date ) )
                return( 1 );
        }

        cur = cur->next;
    }

    return( 0 );
}